

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enorm.c
# Opt level: O0

double enorm(int n,double *x)

{
  long in_RSI;
  int in_EDI;
  double dVar1;
  double agiant;
  double x3max;
  double x1max;
  double xabs;
  double s3;
  double s2;
  double s1;
  int i;
  double d1;
  double ret_val;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined4 local_24;
  undefined8 local_18;
  
  local_30 = 0.0;
  local_38 = 0.0;
  local_40 = 0.0;
  local_50 = 0.0;
  local_58 = 0.0;
  for (local_24 = 0; local_24 < in_EDI; local_24 = local_24 + 1) {
    dVar1 = ABS(*(double *)(in_RSI + (long)local_24 * 8));
    if (dVar1 < 1.34078079299426e+153 / (double)in_EDI) {
      if (1.82691291192569e-153 < dVar1) {
        local_38 = dVar1 * dVar1 + local_38;
      }
      else if (dVar1 <= local_58) {
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          local_40 = (dVar1 / local_58) * (dVar1 / local_58) + local_40;
        }
      }
      else {
        local_40 = local_40 * (local_58 / dVar1) * (local_58 / dVar1) + 1.0;
        local_58 = dVar1;
      }
    }
    else if (dVar1 <= local_50) {
      local_30 = (dVar1 / local_50) * (dVar1 / local_50) + local_30;
    }
    else {
      local_30 = local_30 * (local_50 / dVar1) * (local_50 / dVar1) + 1.0;
      local_50 = dVar1;
    }
  }
  if ((local_30 != 0.0) || (NAN(local_30))) {
    local_18 = sqrt(local_30 + (local_38 / local_50) / local_50);
    local_18 = local_50 * local_18;
  }
  else if ((local_38 != 0.0) || (NAN(local_38))) {
    if (local_38 < local_58) {
      local_18 = sqrt(local_58 * (local_58 * local_40 + local_38 / local_58));
    }
    else {
      local_18 = sqrt(local_38 * ((local_58 / local_38) * local_58 * local_40 + 1.0));
    }
  }
  else {
    local_18 = sqrt(local_40);
    local_18 = local_58 * local_18;
  }
  return local_18;
}

Assistant:

__cminpack_attr__
real __cminpack_func__(enorm)(int n, const real *x)
{
#ifdef USE_BLAS
    const __cminpack_blasint__ c__1 = 1;
    return __cminpack_blas__(nrm2)(&n, x, &c__1);
#else /* !USE_BLAS */
    /* System generated locals */
    real ret_val, d1;

    /* Local variables */
    int i;
    real s1, s2, s3, xabs, x1max, x3max, agiant;

/*     ********** */

/*     function enorm */

/*     given an n-vector x, this function calculates the */
/*     euclidean norm of x. */

/*     the euclidean norm is computed by accumulating the sum of */
/*     squares in three different sums. the sums of squares for the */
/*     small and large components are scaled so that no overflows */
/*     occur. non-destructive underflows are permitted. underflows */
/*     and overflows do not occur in the computation of the unscaled */
/*     sum of squares for the intermediate components. */
/*     the definitions of small, intermediate and large components */
/*     depend on two constants, rdwarf and rgiant. the main */
/*     restrictions on these constants are that rdwarf**2 not */
/*     underflow and rgiant**2 not overflow. the constants */
/*     given here are suitable for every known computer. */

/*     the function statement is */

/*       double precision function enorm(n,x) */

/*     where */

/*       n is a positive integer input variable. */

/*       x is an input array of length n. */

/*     subprograms called */

/*       fortran-supplied ... dabs,dsqrt */

/*     argonne national laboratory. minpack project. march 1980. */
/*     burton s. garbow, kenneth e. hillstrom, jorge j. more */

/*     ********** */

    s1 = 0.;
    s2 = 0.;
    s3 = 0.;
    x1max = 0.;
    x3max = 0.;
    agiant = rgiant / (real)n;
    for (i = 0; i < n; ++i) {
	xabs = fabs(x[i]);
        if (xabs >= agiant) {
/*              sum for large components. */
            if (xabs > x1max) {
                /* Computing 2nd power */
                d1 = x1max / xabs;
                s1 = 1 + s1 * (d1 * d1);
                x1max = xabs;
            } else {
                /* Computing 2nd power */
                d1 = xabs / x1max;
                s1 += d1 * d1;
            }
        } else if (xabs <= rdwarf) {
/*              sum for small components. */
            if (xabs > x3max) {
                /* Computing 2nd power */
                d1 = x3max / xabs;
                s3 = 1 + s3 * (d1 * d1);
                x3max = xabs;
            } else if (xabs != 0.) {
                /* Computing 2nd power */
                d1 = xabs / x3max;
                s3 += d1 * d1;
            }
	} else {
/*           sum for intermediate components. */
            /* Computing 2nd power */
            s2 += xabs * xabs;
        }
    }

/*     calculation of norm. */

    if (s1 != 0.) {
        ret_val = x1max * sqrt(s1 + (s2 / x1max) / x1max);
    } else if (s2 != 0.) {
        if (s2 >= x3max) {
            ret_val = sqrt(s2 * (1 + (x3max / s2) * (x3max * s3)));
        } else {
            ret_val = sqrt(x3max * ((s2 / x3max) + (x3max * s3)));
        }
    } else {
        ret_val = x3max * sqrt(s3);
    }
    return ret_val;

/*     last card of function enorm. */
#endif /* !USE_BLAS */
}